

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::ConnectCancelReadService::connect
          (ConnectCancelReadService *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  undefined8 *in_stack_00000008;
  HttpHeaders local_a8;
  StringPtr local_48;
  AsyncIoStream *connection_local;
  HttpHeaders *headers_local;
  ConnectCancelReadService *this_local;
  StringPtr host_local;
  
  host_local.content.ptr = (char *)CONCAT44(in_register_0000000c,__len);
  headers_local = (HttpHeaders *)CONCAT44(in_register_00000034,__fd);
  this_local = (ConnectCancelReadService *)__addr;
  host_local.content.size_ = (size_t)this;
  StringPtr::StringPtr(&local_48,"OK");
  HttpHeaders::HttpHeaders
            (&local_a8,
             (HttpHeaderTable *)
             (((HttpHeaders *)CONCAT44(in_register_00000034,__fd))->indexedHeaders).ptr);
  (**(code **)*in_stack_00000008)
            (in_stack_00000008,200,local_48.content.ptr,local_48.content.size_,&local_a8);
  HttpHeaders::~HttpHeaders(&local_a8);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (int)this;
}

Assistant:

kj::Promise<void> connect(kj::StringPtr host,
                            const HttpHeaders& headers,
                            kj::AsyncIoStream& connection,
                            ConnectResponse& response,
                            kj::HttpConnectSettings settings) override {
    response.accept(200, "OK", HttpHeaders(headerTable));
    // Return an immediately resolved promise and drop the connection
    return kj::READY_NOW;
  }